

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O3

void __thiscall Assimp::FIFloatValueImpl::~FIFloatValueImpl(FIFloatValueImpl *this)

{
  pointer pcVar1;
  pointer pfVar2;
  
  (this->super_FIFloatValue).super_FIValue._vptr_FIValue =
       (_func_int **)&PTR_toString_abi_cxx11__008c04c8;
  pcVar1 = (this->strValue)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->strValue).field_2) {
    operator_delete(pcVar1);
  }
  (this->super_FIFloatValue).super_FIValue._vptr_FIValue =
       (_func_int **)&PTR___cxa_pure_virtual_008c0508;
  pfVar2 = (this->super_FIFloatValue).value.super__Vector_base<float,_std::allocator<float>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pfVar2 != (pointer)0x0) {
    operator_delete(pfVar2);
    return;
  }
  return;
}

Assistant:

inline FIFloatValueImpl(std::vector<float> &&value_): strValueValid(false) { value = std::move(value_); }